

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_cubical_complex_base.h
# Opt level: O0

uint __thiscall
Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::get_dimension_of_a_cell
          (Bitmap_cubical_complex_base<double> *this,size_t cell)

{
  ulong uVar1;
  const_reference pvVar2;
  size_t newcell;
  size_type sStack_28;
  uint position;
  size_t i;
  size_t sStack_18;
  uint dimension;
  size_t cell_local;
  Bitmap_cubical_complex_base<double> *this_local;
  
  i._4_4_ = 0;
  sStack_28 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->multipliers);
  sStack_18 = cell;
  for (; 1 < sStack_28; sStack_28 = sStack_28 - 1) {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->multipliers,sStack_28 - 1);
    uVar1 = sStack_18 / *pvVar2;
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->multipliers,sStack_28 - 1);
    sStack_18 = sStack_18 % (ulong)*pvVar2;
    if (((uint)uVar1 & 1) == 1) {
      i._4_4_ = i._4_4_ + 1;
    }
  }
  if ((sStack_18 & 1) == 1) {
    i._4_4_ = i._4_4_ + 1;
  }
  return i._4_4_;
}

Assistant:

unsigned Bitmap_cubical_complex_base<T>::get_dimension_of_a_cell(std::size_t cell) const {
#ifdef DEBUG_TRACES
  std::clog << "\n\n\n Computing position o a cell of an index : " << cell << std::endl;
#endif
  unsigned dimension = 0;
  for (std::size_t i = this->multipliers.size(); i > 1; --i) {
    unsigned position = cell / this->multipliers[i - 1];
    std::size_t newcell = cell % this->multipliers[i - 1];

#ifdef DEBUG_TRACES
    std::clog << "i-1 :" << i - 1 << std::endl;
    std::clog << "cell : " << cell << std::endl;
    std::clog << "position : " << position << std::endl;
    std::clog << "multipliers[" << i - 1 << "] = " << this->multipliers[i - 1] << std::endl;
#endif

    if (position % 2 == 1) {
#ifdef DEBUG_TRACES
      std::clog << "Nonzero length in this direction \n";
#endif
      dimension++;
    }
    cell = newcell;
  }
  // Split out the last iteration to save a costly division by multipliers[0]=1
#ifdef DEBUG_TRACES
  std::clog << "i-1 :" << 0 << std::endl;
  std::clog << "cell : " << cell << std::endl;
  std::clog << "position : " << cell << std::endl;
  std::clog << "multipliers[" << 0 << "] = " << 1 << std::endl;
#endif

  if (cell % 2 == 1) {
#ifdef DEBUG_TRACES
    std::clog << "Nonzero length in this direction \n";
#endif
    dimension++;
  }

  return dimension;
}